

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigUtil.c
# Opt level: O3

void Fraig_ManReportChoices(Fraig_Man_t *pMan)

{
  long lVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  Fraig_Node_t *pFVar5;
  uint uVar6;
  uint uVar7;
  
  lVar1 = (long)pMan->vOutputs->nSize;
  uVar3 = 0;
  uVar4 = 0;
  if (0 < lVar1) {
    lVar2 = 0;
    uVar4 = 0;
    do {
      uVar6 = *(uint *)(((ulong)pMan->vOutputs->pArray[lVar2] & 0xfffffffffffffffe) + 8);
      if ((int)uVar4 <= (int)uVar6) {
        uVar4 = uVar6;
      }
      lVar2 = lVar2 + 1;
    } while (lVar1 != lVar2);
  }
  Fraig_MappingSetChoiceLevels(pMan,0);
  lVar1 = (long)pMan->vOutputs->nSize;
  if (0 < lVar1) {
    lVar2 = 0;
    uVar3 = 0;
    do {
      uVar6 = *(uint *)(((ulong)pMan->vOutputs->pArray[lVar2] & 0xfffffffffffffffe) + 8);
      if ((int)uVar3 <= (int)uVar6) {
        uVar3 = uVar6;
      }
      lVar2 = lVar2 + 1;
    } while (lVar1 != lVar2);
  }
  lVar1 = (long)pMan->vNodes->nSize;
  if (lVar1 < 1) {
    uVar6 = 0;
    uVar7 = 0;
  }
  else {
    lVar2 = 0;
    uVar7 = 0;
    uVar6 = 0;
    do {
      pFVar5 = pMan->vNodes->pArray[lVar2];
      if ((pFVar5->pRepr == (Fraig_Node_t *)0x0) && (pFVar5->pNextE != (Fraig_Node_t *)0x0)) {
        uVar7 = uVar7 + 1;
        do {
          uVar6 = uVar6 + 1;
          pFVar5 = pFVar5->pNextE;
        } while (pFVar5 != (Fraig_Node_t *)0x0);
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 != lVar1);
  }
  printf("Maximum level: Original = %d. Reduced due to choices = %d.\n",(ulong)uVar4,(ulong)uVar3);
  printf("Choice stats:  Choice nodes = %d. Total choices = %d.\n",(ulong)uVar7,(ulong)uVar6);
  return;
}

Assistant:

void Fraig_ManReportChoices( Fraig_Man_t * pMan )
{
    Fraig_Node_t * pNode, * pTemp;
    int nChoiceNodes, nChoices;
    int i, LevelMax1, LevelMax2;

    // report the number of levels
    LevelMax1 = Fraig_GetMaxLevel( pMan );
    Fraig_MappingSetChoiceLevels( pMan, 0 );
    LevelMax2 = Fraig_GetMaxLevel( pMan );

    // report statistics about choices
    nChoiceNodes = nChoices = 0;
    for ( i = 0; i < pMan->vNodes->nSize; i++ )
    {
        pNode = pMan->vNodes->pArray[i];
        if ( pNode->pRepr == NULL && pNode->pNextE != NULL )
        { // this is a choice node = the primary node that has equivalent nodes
            nChoiceNodes++;
            for ( pTemp = pNode; pTemp; pTemp = pTemp->pNextE )
                nChoices++;
        }
    }
    printf( "Maximum level: Original = %d. Reduced due to choices = %d.\n", LevelMax1, LevelMax2 );
    printf( "Choice stats:  Choice nodes = %d. Total choices = %d.\n", nChoiceNodes, nChoices );
}